

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O0

bool __thiscall spvtools::opt::DominatorTree::Dominates(DominatorTree *this,uint32_t a,uint32_t b)

{
  DominatorTreeNode *a_00;
  DominatorTreeNode *b_00;
  DominatorTreeNode *b_node;
  DominatorTreeNode *a_node;
  uint32_t b_local;
  uint32_t a_local;
  DominatorTree *this_local;
  
  a_00 = GetTreeNode(this,a);
  b_00 = GetTreeNode(this,b);
  if ((a_00 == (DominatorTreeNode *)0x0) || (b_00 == (DominatorTreeNode *)0x0)) {
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = Dominates(this,a_00,b_00);
  }
  return this_local._7_1_;
}

Assistant:

bool DominatorTree::Dominates(uint32_t a, uint32_t b) const {
  // Check that both of the inputs are actual nodes.
  const DominatorTreeNode* a_node = GetTreeNode(a);
  const DominatorTreeNode* b_node = GetTreeNode(b);
  if (!a_node || !b_node) return false;

  return Dominates(a_node, b_node);
}